

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sam_header.c
# Opt level: O3

void sam_hdr_dump(SAM_hdr *hdr)

{
  ushort uVar1;
  SAM_hdr_type *pSVar2;
  undefined8 in_RAX;
  kh_sam_hdr_t *pkVar3;
  SAM_PG *pSVar4;
  int iVar5;
  uint uVar6;
  long lVar7;
  uint uVar8;
  char *pcVar9;
  SAM_hdr_tag *pSVar10;
  ulong uVar11;
  SAM_hdr_item_s *pSVar12;
  char c [2];
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  puts("===DUMP===");
  pkVar3 = hdr->h;
  uVar6 = pkVar3->n_buckets;
  if (uVar6 != 0) {
    uVar8 = 0;
    do {
      if ((pkVar3->flags[uVar8 >> 4] >> ((char)uVar8 * '\x02' & 0x1fU) & 3) == 0) {
        pSVar2 = pkVar3->vals[uVar8];
        uVar1 = (ushort)pkVar3->keys[uVar8];
        uStack_38 = CONCAT26(uVar1 << 8 | uVar1 >> 8,(undefined6)uStack_38);
        printf("Type %.2s, count %d\n",(long)&uStack_38 + 6,(ulong)(pSVar2->prev->order + 1));
        pSVar12 = pSVar2;
        do {
          printf(">>>%d ",(ulong)(uint)pSVar12->order);
          for (pSVar10 = pSVar12->tag; pSVar10 != (SAM_hdr_tag *)0x0; pSVar10 = pSVar10->next) {
            printf("\"%.2s\":\"%.*s\"\t",pSVar10->str,(ulong)(pSVar10->len - 3),pSVar10->str + 3);
          }
          putchar(10);
          pSVar12 = pSVar12->next;
        } while (pSVar12 != pSVar2);
        pkVar3 = hdr->h;
        uVar6 = pkVar3->n_buckets;
      }
      uVar8 = uVar8 + 1;
    } while (uVar8 != uVar6);
  }
  puts("\n@PG chains:");
  if (0 < hdr->npg_end) {
    uVar11 = 0;
    do {
      printf("  %d:",uVar11 & 0xffffffff);
      iVar5 = hdr->pg_end[uVar11];
      if (iVar5 != -1) {
        pSVar4 = hdr->pg;
        do {
          pcVar9 = "->";
          if (iVar5 == hdr->pg_end[uVar11]) {
            pcVar9 = " ";
          }
          lVar7 = (long)iVar5;
          printf("%s%d(%.*s)",pcVar9,lVar7,(ulong)(uint)pSVar4[lVar7].name_len,pSVar4[lVar7].name);
          pSVar4 = hdr->pg;
          iVar5 = pSVar4[lVar7].prev_id;
        } while (iVar5 != -1);
      }
      putchar(10);
      uVar11 = uVar11 + 1;
    } while ((long)uVar11 < (long)hdr->npg_end);
  }
  puts("===END DUMP===");
  return;
}

Assistant:

void sam_hdr_dump(SAM_hdr *hdr) {
    khint_t k;
    int i;

    printf("===DUMP===\n");
    for (k = kh_begin(hdr->h); k != kh_end(hdr->h); k++) {
	SAM_hdr_type *t1, *t2;
	char c[2];

	if (!kh_exist(hdr->h, k))
	    continue;

	t1 = t2 = kh_val(hdr->h, k);
	c[0] = kh_key(hdr->h, k)>>8;
	c[1] = kh_key(hdr->h, k)&0xff;
	printf("Type %.2s, count %d\n", c, t1->prev->order+1);

	do {
	    SAM_hdr_tag *tag;
	    printf(">>>%d ", t1->order);
	    for (tag = t1->tag; tag; tag=tag->next) {
		printf("\"%.2s\":\"%.*s\"\t",
		       tag->str, tag->len-3, tag->str+3);
	    }
	    putchar('\n');
	    t1 = t1->next;
	} while (t1 != t2);
    }

    /* Dump out PG chains */
    printf("\n@PG chains:\n");
    for (i = 0; i < hdr->npg_end; i++) {
	int j;
	printf("  %d:", i);
	for (j = hdr->pg_end[i]; j != -1; j = hdr->pg[j].prev_id) {
	    printf("%s%d(%.*s)", 
		   j == hdr->pg_end[i] ? " " : "->",
		   j, hdr->pg[j].name_len, hdr->pg[j].name);
	}
	printf("\n");
    }

    puts("===END DUMP===");
}